

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_New_Memory_Face(FT_Library library,FT_Byte *file_base,FT_Long file_size,
                           FT_Long face_index,FT_Face_conflict *aface)

{
  FT_Error FVar1;
  FT_Open_Args args;
  FT_Open_Args local_40;
  
  if (file_base != (FT_Byte *)0x0) {
    local_40.flags = 1;
    local_40.stream = (FT_Stream)0x0;
    local_40.memory_base = file_base;
    local_40.memory_size = file_size;
    FVar1 = ft_open_face_internal(library,&local_40,face_index,aface,'\x01');
    return FVar1;
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Memory_Face( FT_Library      library,
                      const FT_Byte*  file_base,
                      FT_Long         file_size,
                      FT_Long         face_index,
                      FT_Face        *aface )
  {
    FT_Open_Args  args;


    /* test for valid `library' and `face' delayed to `FT_Open_Face' */
    if ( !file_base )
      return FT_THROW( Invalid_Argument );

    args.flags       = FT_OPEN_MEMORY;
    args.memory_base = file_base;
    args.memory_size = file_size;
    args.stream      = NULL;

    return ft_open_face_internal( library, &args, face_index, aface, 1 );
  }